

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O1

value_type * __thiscall
google::
dense_hashtable<std::pair<HashObject<4,4>const,int>,HashObject<4,4>,HashFn,google::dense_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SelectKey,google::dense_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SetKey,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>
::find_or_insert<int,HashObject<4,4>>
          (dense_hashtable<std::pair<HashObject<4,4>const,int>,HashObject<4,4>,HashFn,google::dense_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SelectKey,google::dense_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SetKey,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>
           *this,HashObject<4,_4> *key)

{
  bool bVar1;
  pair<unsigned_long,_unsigned_long> pVar2;
  int local_44;
  pair<google::dense_hashtable_iterator<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::dense_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>,_bool>
  local_40;
  
  pVar2 = find_position<HashObject<4,4>>(this,key);
  if (pVar2.first == 0xffffffffffffffff) {
    bVar1 = dense_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::dense_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
            ::resize_delta((dense_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::dense_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
                            *)this,1);
    if (bVar1) {
      local_44 = 0;
      insert_noresize<HashObject<4,4>,HashObject<4,4>,int>(&local_40,this,key,key,&local_44);
    }
    else {
      local_44 = 0;
      insert_at<HashObject<4,4>,int>(&local_40.first,this,pVar2.second,key,&local_44);
    }
  }
  else {
    local_40.first.pos = (pointer)(pVar2.first * 8 + *(long *)(this + 0x48));
  }
  return local_40.first.pos;
}

Assistant:

value_type& find_or_insert(K&& key) {
    // First, double-check we're not inserting emptykey or delkey
    assert(
        (!settings.use_empty() || !equals(key, key_info.empty_key)) &&
        "Inserting the empty key");
    assert((!settings.use_deleted() || !equals(key, key_info.delkey)) &&
           "Inserting the deleted key");
    const std::pair<size_type, size_type> pos = find_position(key);
    if (pos.first != ILLEGAL_BUCKET) {  // object was already there
      return table[pos.first];
    } else if (resize_delta(1)) {  // needed to rehash to make room
      // Since we resized, we can't use pos, so recalculate where to insert.
      return *insert_noresize(std::forward<K>(key), std::forward<K>(key), T()).first;
    } else {  // no need to rehash, insert right here
      return *insert_at(pos.second, std::forward<K>(key), T());
    }
  }